

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FiniteModelMultiSorted.hpp
# Opt level: O2

uint __thiscall
FMB::FiniteModelMultiSorted::args2var
          (FiniteModelMultiSorted *this,DArray<unsigned_int> *args,DArray<unsigned_int> *sizes,
          DArray<unsigned_int> *offsets,uint s,OperatorType *sig)

{
  uint idx;
  TermList TVar1;
  uint uVar2;
  int iVar3;
  
  uVar2 = offsets->_array[s];
  iVar3 = 1;
  for (idx = 0; (ulong)idx < args->_size; idx = idx + 1) {
    uVar2 = uVar2 + (args->_array[idx] - 1) * iVar3;
    TVar1 = Kernel::OperatorType::arg(sig,idx);
    iVar3 = iVar3 * sizes->_array[*(uint *)(TVar1._content + 8)];
  }
  return uVar2;
}

Assistant:

unsigned args2var(const DArray<unsigned>& args, const DArray<unsigned>& sizes,
                    const DArray<unsigned>& offsets, unsigned s, OperatorType* sig)
  {
    unsigned var = offsets[s];
    unsigned mult = 1;
    for(unsigned i=0;i<args.size();i++){
      var += mult*(args[i]-1);
      unsigned s = sig->arg(i).term()->functor();
      mult *=sizes[s];
    }
    return var;
  }